

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mars.cpp
# Opt level: O0

void __thiscall MARS::f_trans(MARS *this,uint *a,uint *b,uint *c,uint *d,uint i)

{
  reference key2;
  __tuple_element_t<0UL,_tuple<unsigned_int,_unsigned_int,_unsigned_int>_> *p_Var1;
  __tuple_element_t<1UL,_tuple<unsigned_int,_unsigned_int,_unsigned_int>_> *p_Var2;
  __tuple_element_t<2UL,_tuple<unsigned_int,_unsigned_int,_unsigned_int>_> *p_Var3;
  type_conflict *out3;
  type_conflict *out2;
  type_conflict *out1;
  uint local_3c;
  uint *puStack_38;
  uint i_local;
  uint *d_local;
  uint *c_local;
  uint *b_local;
  uint *a_local;
  MARS *this_local;
  
  local_3c = i;
  puStack_38 = d;
  d_local = c;
  c_local = b;
  b_local = a;
  a_local = (uint *)this;
  key2 = std::array<unsigned_int,_40UL>::operator[](&this->K,(ulong)(i * 2 + 4));
  std::array<unsigned_int,_40UL>::operator[](&this->K,(ulong)(local_3c * 2 + 5));
  e_func((MARS *)&out1,(uint *)this,a,key2);
  p_Var1 = std::get<0ul,unsigned_int,unsigned_int,unsigned_int>
                     ((tuple<unsigned_int,_unsigned_int,_unsigned_int> *)&out1);
  p_Var2 = std::get<1ul,unsigned_int,unsigned_int,unsigned_int>
                     ((tuple<unsigned_int,_unsigned_int,_unsigned_int> *)&out1);
  p_Var3 = std::get<2ul,unsigned_int,unsigned_int,unsigned_int>
                     ((tuple<unsigned_int,_unsigned_int,_unsigned_int> *)&out1);
  *b_local = *b_local << 0xd | *b_local >> 0x13;
  *d_local = *p_Var2 + *d_local;
  *c_local = *p_Var1 + *c_local;
  *puStack_38 = *puStack_38 ^ *p_Var3;
  return;
}

Assistant:

void MARS::f_trans(unsigned &a, unsigned &b, unsigned &c, unsigned &d, unsigned i) {
    auto[out1, out2, out3] = e_func(a, K[2 * i + 4], K[2 * i + 5]);
    a = rotl(a, 13);
    c += out2;
    b += out1;
    d = d ^ out3;
}